

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::BlenderImporter::CanRead
          (BlenderImporter *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  bool bVar2;
  string local_40;
  
  BaseImporter::GetExtension(&local_40,pFile);
  bVar1 = std::operator==(&local_40,"blend");
  bVar2 = true;
  if (bVar1) goto LAB_004636b3;
  if (local_40._M_string_length == 0) {
    if (pIOHandler != (IOSystem *)0x0) goto LAB_0046368e;
  }
  else if (pIOHandler != (IOSystem *)0x0 && checkSig) {
LAB_0046368e:
    bVar2 = BaseImporter::SearchFileHeaderForToken
                      (pIOHandler,pFile,TokensForSearch,1,200,false,false);
    goto LAB_004636b3;
  }
  bVar2 = false;
LAB_004636b3:
  std::__cxx11::string::~string((string *)&local_40);
  return bVar2;
}

Assistant:

bool BlenderImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const
{
    const std::string& extension = GetExtension(pFile);
    if (extension == "blend") {
        return true;
    }

    else if ((!extension.length() || checkSig) && pIOHandler)   {
        // note: this won't catch compressed files
        return SearchFileHeaderForToken(pIOHandler,pFile, TokensForSearch,1);
    }
    return false;
}